

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O0

void __thiscall fw::FreeCamera::moveRelatively(FreeCamera *this,vec3 *movement)

{
  float fVar1;
  vec3 vVar2;
  tvec3<float,_(glm::precision)0> tVar3;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_e0;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_d0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined8 local_a0;
  float local_98;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_90;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_80;
  undefined1 local_70 [16];
  undefined8 local_60;
  float local_58;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_40;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_30;
  undefined1 local_24 [8];
  tvec3<float,_(glm::precision)0> relativeMovement;
  vec3 *movement_local;
  FreeCamera *this_local;
  
  fVar1 = (movement->field_0).field_0.z;
  relativeMovement.field_0._4_8_ = movement;
  vVar2 = getWorldForwardDirection(this);
  local_58 = vVar2.field_0._8_4_;
  local_60 = vVar2.field_0._0_8_;
  local_50._0_8_ = local_60;
  local_50.field_0.z = local_58;
  local_70._0_12_ =
       (undefined1  [12])glm::operator*(fVar1,(tvec3<float,_(glm::precision)0> *)&local_50.field_0);
  local_40.field_0.z = (float)local_70._8_4_;
  local_40._0_8_ = local_70._0_8_;
  fVar1 = *(float *)(relativeMovement.field_0._4_8_ + 4);
  vVar2 = getWorldUpDirection(this);
  local_98 = vVar2.field_0._8_4_;
  local_a0 = vVar2.field_0._0_8_;
  local_90._0_8_ = local_a0;
  local_90.field_0.z = local_98;
  local_b0._0_12_ =
       (undefined1  [12])glm::operator*(fVar1,(tvec3<float,_(glm::precision)0> *)&local_90.field_0);
  local_80.field_0.z = (float)local_b0._8_4_;
  local_80._0_8_ = local_b0._0_8_;
  local_c0._0_12_ =
       (undefined1  [12])
       glm::operator+((tvec3<float,_(glm::precision)0> *)&local_40.field_0,
                      (tvec3<float,_(glm::precision)0> *)&local_80.field_0);
  local_30.field_0.z = (float)local_c0._8_4_;
  local_30._0_8_ = local_c0._0_8_;
  fVar1 = *(float *)relativeMovement.field_0._4_8_;
  vVar2 = getWorldRightDirection(this);
  local_e0.field_0.z = (float)vVar2.field_0._8_4_;
  local_e0._0_8_ = vVar2.field_0._0_8_;
  tVar3 = glm::operator*(fVar1,(tvec3<float,_(glm::precision)0> *)&local_e0.field_0);
  local_f8 = tVar3.field_0._8_4_;
  local_d0.field_0.z = local_f8;
  local_100 = tVar3.field_0._0_8_;
  local_d0._0_8_ = local_100;
  tVar3 = glm::operator+((tvec3<float,_(glm::precision)0> *)&local_30.field_0,
                         (tvec3<float,_(glm::precision)0> *)&local_d0.field_0);
  local_110 = tVar3.field_0._0_8_;
  local_24 = (undefined1  [8])local_110;
  local_108 = tVar3.field_0._8_4_;
  relativeMovement.field_0.field_0.x = local_108;
  glm::tvec3<float,(glm::precision)0>::operator+=
            ((tvec3<float,(glm::precision)0> *)this,(tvec3<float,_(glm::precision)0> *)local_24);
  return;
}

Assistant:

void FreeCamera::moveRelatively(const glm::vec3& movement)
{
    auto relativeMovement =
        movement.z * getWorldForwardDirection()
        + movement.y * getWorldUpDirection()
        + movement.x * getWorldRightDirection();

    _worldPosition += relativeMovement;
}